

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void __thiscall rtosc::Port_Matcher::~Port_Matcher(Port_Matcher *this)

{
  undefined8 *in_RDI;
  vector<const_char_*,_std::allocator<const_char_*>_> *unaff_retaddr;
  
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  return;
}

Assistant:

~Port_Matcher() { delete[] m_enump; }